

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

void check_special_room(boolean newlev)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  level *lev;
  boolean bVar6;
  char *pcVar7;
  char *pcVar8;
  mkroom *pmVar9;
  int roomno;
  char cVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  monst *pmVar15;
  char *pcVar16;
  char *local_60;
  
  pcVar16 = u.urooms;
  strcpy(u.urooms0,u.urooms);
  pcVar14 = u.ushops0;
  pcVar13 = u.ushops;
  strcpy(u.ushops0,u.ushops);
  if (newlev == '\0') {
    pcVar7 = in_rooms(level,u.ux,u.uy,0);
    strcpy(u.urooms,pcVar7);
    local_60 = u.ushops_entered;
    pcVar7 = u.uentered;
    while( true ) {
      cVar10 = *pcVar16;
      if (cVar10 == 0) break;
      pcVar8 = strchr(u.urooms0,(int)cVar10);
      if (pcVar8 == (char *)0x0) {
        *pcVar7 = cVar10;
        pcVar7 = pcVar7 + 1;
        cVar10 = *pcVar16;
      }
      if ('\x11' < *(char *)((long)level->monsters + (long)cVar10 * 0xd8 + 0x335c)) {
        *pcVar13 = cVar10;
        pcVar13 = pcVar13 + 1;
        cVar10 = *pcVar16;
        pcVar8 = strchr(u.ushops0,(int)cVar10);
        if (pcVar8 == (char *)0x0) {
          *local_60 = cVar10;
          local_60 = local_60 + 1;
        }
      }
      pcVar16 = pcVar16 + 1;
    }
    *pcVar7 = '\0';
    *pcVar13 = '\0';
    *local_60 = '\0';
    pcVar16 = u.ushops_left;
    while( true ) {
      cVar10 = *pcVar14;
      if (cVar10 == '\0') break;
      pcVar13 = strchr(u.ushops,(int)cVar10);
      if (pcVar13 == (char *)0x0) {
        *pcVar16 = cVar10;
        pcVar16 = pcVar16 + 1;
      }
      pcVar14 = pcVar14 + 1;
    }
    *pcVar16 = '\0';
  }
  else {
    u.urooms[0] = '\0';
    u.uentered[0] = '\0';
    u.ushops[0] = '\0';
    u.ushops_entered[0] = '\0';
    strcpy(u.ushops_left,u.ushops0);
  }
  if (u.ushops0[0] != '\0') {
    u_left_shop(u.ushops_left,newlev);
  }
  if (u.uentered[0] != '\0' || u.ushops_entered[0] != '\0') {
    if (u.ushops_entered[0] != '\0') {
      u_entered_shop(u.ushops_entered);
    }
    for (pcVar16 = u.uentered; roomno = (int)*pcVar16, *pcVar16 != '\0'; pcVar16 = pcVar16 + 1) {
      uVar11 = (uint)*(byte *)((long)level->monsters + (long)roomno * 0xd8 + 0x335c);
      if (0xe < uVar11 - 2) goto switchD_001a4270_caseD_4;
      iVar12 = roomno + -3;
      switch(uVar11) {
      case 2:
        bVar2 = 0;
        pline("You enter an opulent throne room!");
        bVar3 = 1;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 2;
        break;
      case 3:
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a445d;
          pcVar14 = "looks";
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a4451;
LAB_001a45c1:
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a45f2;
          pcVar13 = "muddy";
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a45e6;
        }
        else {
LAB_001a4451:
          pcVar14 = "feels";
          if (ublindf != (obj *)0x0) {
LAB_001a445d:
            pcVar14 = "feels";
            if (ublindf->oartifact == '\x1d') {
              pcVar14 = "looks";
            }
          }
          if (u.uprops[0x1e].intrinsic == 0) goto LAB_001a45c1;
LAB_001a45e6:
          pcVar13 = "humid";
          if (ublindf != (obj *)0x0) {
LAB_001a45f2:
            pcVar13 = "humid";
            if (ublindf->oartifact == '\x1d') {
              pcVar13 = "muddy";
            }
          }
        }
        bVar3 = 0;
        pline("It %s rather %s down here.",pcVar14,pcVar13);
        bVar2 = 1;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 3;
        break;
      case 4:
        goto switchD_001a4270_caseD_4;
      case 5:
        pcVar14 = "You enter a giant beehive!";
        goto LAB_001a4563;
      case 6:
        iVar12 = midnight();
        if (iVar12 == 0) {
          pline("You have an uncanny feeling...");
        }
        else {
          pcVar14 = locomotion(youmonst.data,"Run");
          pline("%s away!  %s away!",pcVar14,pcVar14);
        }
        bVar3 = 0;
        bVar5 = 1;
        bVar2 = 0;
        bVar4 = 0;
        iVar12 = 6;
        break;
      case 7:
        bVar6 = monstinroom(mons + 0x121,iVar12);
        if ((((bVar6 == '\0') && (bVar6 = monstinroom(mons + 0x122,iVar12), bVar6 == '\0')) &&
            (bVar6 = monstinroom(mons + 0x123,iVar12), bVar6 == '\0')) &&
           (bVar6 = monstinroom(mons + 0x124,iVar12), bVar6 == '\0')) {
          pcVar14 = "You enter an abandoned barracks.";
        }
        else {
          pcVar14 = "You enter a military barracks!";
        }
        bVar3 = 0;
        pline(pcVar14);
        bVar2 = 0;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 7;
        break;
      case 8:
        bVar3 = 0;
        pline("Welcome to David\'s treasure zoo!");
        bVar4 = 1;
        bVar2 = 0;
        bVar5 = 0;
        iVar12 = 8;
        break;
      case 9:
        bVar6 = monstinroom(mons + 0x11e,iVar12);
        if (bVar6 != '\0') {
          pcVar14 = Hello((monst *)0x0);
          verbalize("%s, %s, welcome to Delphi!",pcVar14,plname);
        }
        check_tutorial_message(0x16c);
        bVar3 = 0;
        bVar2 = 0;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 9;
        break;
      case 10:
        intemple(roomno);
        goto switchD_001a4270_caseD_4;
      case 0xb:
        bVar3 = 0;
        pline("You enter a leprechaun hall!");
        bVar2 = 0;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 0xb;
        break;
      case 0xc:
        bVar3 = 0;
        pline("You enter a disgusting nest!");
        bVar2 = 0;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 0xc;
        break;
      case 0xd:
        bVar3 = 0;
        pline("You enter an anthole!");
        bVar2 = 0;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 0xd;
        break;
      case 0xe:
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a43d3;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a43ce;
LAB_001a455c:
          pcVar14 = "You enter a beautiful garden.";
        }
        else {
LAB_001a43ce:
          if (ublindf != (obj *)0x0) {
LAB_001a43d3:
            if (ublindf->oartifact == '\x1d') goto LAB_001a455c;
          }
          pcVar14 = "The air here smells nice and fresh!";
        }
LAB_001a4563:
        pline(pcVar14);
        goto switchD_001a4270_caseD_4;
      case 0xf:
        bVar3 = 0;
        pline("You enter a dilapidated armory.");
        bVar2 = 0;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 0xf;
        break;
      case 0x10:
        bVar3 = 0;
        pline("You enter a put of screaming lemures!");
        bVar2 = 0;
        bVar5 = 0;
        bVar4 = 0;
        iVar12 = 0x10;
      }
      lev = level;
      *(undefined1 *)((long)level->monsters + (long)roomno * 0xd8 + 0x335c) = 0;
      pmVar9 = search_special(lev,(schar)iVar12);
      if (((pmVar9 == (mkroom *)0x0) && (uVar11 = iVar12 - 2, uVar11 < 0xf)) &&
         ((0x517bU >> (uVar11 & 0x1f) & 1) != 0)) {
        puVar1 = &(level->flags).field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 & *(uint *)(&DAT_00298b48 + (ulong)uVar11 * 4);
      }
      if ((bool)(bVar5 | bVar4 | bVar3 | bVar2)) {
        pmVar15 = (monst *)&level->monlist;
        while (pmVar15 = pmVar15->nmon, pmVar15 != (monst *)0x0) {
          if (((0 < pmVar15->mhp) && ((byte)(pmVar15->mx - 1U) < 0x4f)) &&
             ((byte)pmVar15->my < 0x15)) {
            pcVar14 = in_rooms(level,pmVar15->mx,pmVar15->my,0);
            pcVar14 = strchr(pcVar14,roomno);
            if (((pcVar14 != (char *)0x0) &&
                ((u.uprops[0x13].extrinsic == 0 && u.uprops[0x13].intrinsic == 0 ||
                 (u.uprops[0x13].blocked != 0)))) && (uVar11 = mt_random(), uVar11 % 3 == 0)) {
              pmVar15->field_0x62 = pmVar15->field_0x62 & 0xf7;
            }
          }
        }
      }
switchD_001a4270_caseD_4:
    }
  }
  return;
}

Assistant:

void check_special_room(boolean newlev)
{
	struct monst *mtmp;
	char *ptr;

	move_update(newlev);

	if (*u.ushops0)
	    u_left_shop(u.ushops_left, newlev);

	if (!*u.uentered && !*u.ushops_entered)		/* implied by newlev */
	    return;		/* no entrance messages necessary */

	/* Did we just enter a shop? */
	if (*u.ushops_entered)
	    u_entered_shop(u.ushops_entered);

	for (ptr = &u.uentered[0]; *ptr; ptr++) {
	    int roomno = *ptr - ROOMOFFSET;
	    int rt = level->rooms[roomno].rtype;

	    /* Did we just enter some other special room? */
	    /* vault.c insists that a vault remain a VAULT,
	     * and temples should remain TEMPLEs,
	     * but everything else gives a message only the first time */
	    switch (rt) {
		case ZOO:
		    pline("Welcome to David's treasure zoo!");
		    break;
		case GARDEN:
		    if (Blind) pline("The air here smells nice and fresh!");
		    else pline("You enter a beautiful garden.");
		    rt = 0;
		    break;
		case SWAMP:
		    pline("It %s rather %s down here.",
			  Blind ? "feels" : "looks",
			  Blind ? "humid" : "muddy");
		    break;
		case COURT:
		    pline("You enter an opulent throne room!");
		    break;
		case LEPREHALL:
		    pline("You enter a leprechaun hall!");
		    break;
		case MORGUE:
		    if (midnight()) {
			const char *run = locomotion(youmonst.data, "Run");
			pline("%s away!  %s away!", run, run);
		    } else
			pline("You have an uncanny feeling...");
		    break;
		case BEEHIVE:
		    pline("You enter a giant beehive!");
		    rt = 0;
		    break;
		case LEMUREPIT:
		    pline("You enter a put of screaming lemures!");
		    break;
		case COCKNEST:
		    pline("You enter a disgusting nest!");
		    break;
		case ARMORY:
		    pline("You enter a dilapidated armory.");
		    break;
		case ANTHOLE:
		    pline("You enter an anthole!");
		    break;
		case BARRACKS:
		    if (monstinroom(&mons[PM_SOLDIER], roomno) ||
			monstinroom(&mons[PM_SERGEANT], roomno) ||
			monstinroom(&mons[PM_LIEUTENANT], roomno) ||
			monstinroom(&mons[PM_CAPTAIN], roomno))
			pline("You enter a military barracks!");
		    else
			pline("You enter an abandoned barracks.");
		    break;
		case DELPHI:
		    if (monstinroom(&mons[PM_ORACLE], roomno))
			verbalize("%s, %s, welcome to Delphi!",
					Hello(NULL), plname);
		    check_tutorial_message(QT_T_ORACLE);
		    break;
		case TEMPLE:
		    intemple(roomno + ROOMOFFSET);
		    /* fall through */
		default:
		    rt = 0;
	    }

	    if (rt != 0) {
		level->rooms[roomno].rtype = OROOM;
		if (!search_special(level, rt)) {
			/* No more room of that type */
			switch(rt) {
			    case COURT:
				level->flags.has_court = 0;
				break;
			    case GARDEN:
				level->flags.has_garden = 0;
				break;
			    case SWAMP:
				level->flags.has_swamp = 0;
				break;
			    case MORGUE:
				level->flags.has_morgue = 0;
				break;
			    case ZOO:
				level->flags.has_zoo = 0;
				break;
			    case BARRACKS:
				level->flags.has_barracks = 0;
				break;
			    case TEMPLE:
				level->flags.has_temple = 0;
				break;
			    case BEEHIVE:
				level->flags.has_beehive = 0;
				break;
			    case LEMUREPIT:
				level->flags.has_lemurepit = 0;
				break;
			}
		}
		if (rt == COURT || rt == SWAMP || rt == MORGUE ||
			rt == ZOO || rt == GARDEN) {
		    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
			if (!DEADMONSTER(mtmp) && isok(mtmp->mx, mtmp->my) &&
				/* wake monsters in the room, not the whole level */
				strchr(in_rooms(level, mtmp->mx, mtmp->my, 0),
				       roomno + ROOMOFFSET) &&
				!Stealth && !rn2(3))
			    mtmp->msleeping = 0;
		    }
		}
	    }
	}

	return;
}